

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshSimplify.cpp
# Opt level: O2

Vec3d * __thiscall
MeshSimplify::calVertexPos(Vec3d *__return_storage_ptr__,MeshSimplify *this,Edge *e,Matrix *m)

{
  Solve *this_00;
  Vec3d mid;
  Vector4 ans;
  Vec3d local_90;
  Vector4 local_78;
  Vector4 local_48;
  
  operator+((Vec3d *)(&this->vGroup->field_0x8 + (long)e->v1 * 0x50),
            (Vec3d *)(&this->vGroup->field_0x8 + (long)e->v2 * 0x50));
  local_78.v[0] = 2.0;
  operator/((Vec3d *)&local_48,local_78.v);
  Vec3d::~Vec3d((Vec3d *)&local_48);
  m->mat[3][2] = 0.0;
  m->mat[3][0] = 0.0;
  m->mat[3][1] = 0.0;
  m->mat[3][3] = 1.0;
  local_48.v[0] = 0.0;
  local_48.v[1] = 0.0;
  local_48.v[2] = 0.0;
  local_48.v[3] = 1.0;
  this_00 = (Solve *)operator_new(0xf0);
  Solve::Solve(this_00,m,&local_48);
  Solve::getAns(&local_78,this_00);
  if (local_78.v[3] <= 1e-08) {
    __return_storage_ptr__->z = local_90.z;
    __return_storage_ptr__->x = local_90.x;
    __return_storage_ptr__->y = local_90.y;
  }
  else {
    __return_storage_ptr__->x = local_78.v[0];
    __return_storage_ptr__->y = local_78.v[1];
    __return_storage_ptr__->z = local_78.v[2];
  }
  Vector4::~Vector4(&local_78);
  Vector4::~Vector4(&local_48);
  Vec3d::~Vec3d(&local_90);
  return __return_storage_ptr__;
}

Assistant:

Vec3d MeshSimplify::calVertexPos(Edge& e,Matrix m){
	Vec3d mid = (vGroup->group[e.v1].pos + vGroup->group[e.v2].pos) / 2;
	m.mat[3][0] = 0;
	m.mat[3][1] = 0;
	m.mat[3][2] = 0;
	m.mat[3][3] = 1;
	
	Vector4 Y(0,0,0,1);
	Solve* solve = new Solve(m,Y);
	Vector4 ans = solve->getAns();
	if(ans.v[3] > Config::EPS)
		return Vec3d(ans.v[0],ans.v[1],ans.v[2]);
	else
		return mid;
}